

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O0

void print_bool(string *path,bool value)

{
  ostream *poVar1;
  char *pcVar2;
  bool value_local;
  string *path_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)path);
  poVar1 = std::operator<<(poVar1,": bool: ");
  pcVar2 = "false";
  if (value) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
print_bool(std::string const& path, bool value)
{
    std::cout << path << ": bool: " << (value ? "true" : "false") << std::endl;
}